

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

wchar_t rd_ignore(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  char *message;
  object_kind *poVar4;
  quark_t qVar5;
  size_t sVar6;
  ulong uVar7;
  uint8_t *ip;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  uint16_t inscriptions;
  int16_t runeid;
  uint16_t itype_size;
  uint16_t file_e_max;
  uint8_t tmp8u;
  bitflag itypes [4];
  
  tmp8u = '\x18';
  rd_byte(&tmp8u);
  if (tmp8u == '\x19') {
    ip = ignore_level;
    sVar6 = 0x19;
    while (bVar10 = sVar6 != 0, sVar6 = sVar6 - 1, bVar10) {
      rd_byte(ip);
      ip = ip + 1;
    }
  }
  else {
    strip_bytes((uint)tmp8u);
  }
  rd_u16b(&file_e_max);
  rd_u16b(&itype_size);
  if (itype_size < 5) {
    for (uVar7 = 0; uVar7 < file_e_max; uVar7 = uVar7 + 1) {
      if (uVar7 < z_info->e_max) {
        rd_byte((uint8_t *)&inscriptions);
        e_info[uVar7].everseen = (_Bool)((byte)inscriptions >> 1 & 1);
        for (uVar8 = 0; uVar8 < itype_size; uVar8 = uVar8 + 1) {
          rd_byte(itypes + uVar8);
        }
        if (itype_size == 4) {
          for (lVar9 = 0; lVar9 != 0x19; lVar9 = lVar9 + 1) {
            _Var1 = flag_has_dbg(itypes,4,(wchar_t)lVar9,"itypes","j");
            if (_Var1) {
              ego_ignore_toggle((wchar_t)uVar7,(wchar_t)lVar9);
            }
          }
        }
      }
    }
    rd_u16b(&inscriptions);
    for (uVar7 = 0; uVar7 < inscriptions; uVar7 = uVar7 + 1) {
      rd_string((char *)itypes,0x50);
      wVar2 = tval_find_idx((char *)itypes);
      rd_string((char *)itypes,0x50);
      wVar2 = wVar2 & 0xff;
      wVar3 = lookup_sval(wVar2,(char *)itypes);
      poVar4 = lookup_kind(wVar2,wVar3 & 0xffU);
      if (poVar4 == (object_kind *)0x0) {
        quit_fmt("lookup_kind(%d, %d) failed",(ulong)(uint)wVar2,(ulong)(uint)(wVar3 & 0xffU));
      }
      rd_string((char *)itypes,0x50);
      qVar5 = quark_add((char *)itypes);
      poVar4->note_aware = qVar5;
    }
    rd_u16b(&inscriptions);
    for (uVar7 = 0; uVar7 < inscriptions; uVar7 = uVar7 + 1) {
      rd_string((char *)itypes,0x50);
      wVar2 = tval_find_idx((char *)itypes);
      rd_string((char *)itypes,0x50);
      wVar2 = wVar2 & 0xff;
      wVar3 = lookup_sval(wVar2,(char *)itypes);
      poVar4 = lookup_kind(wVar2,wVar3 & 0xffU);
      if (poVar4 == (object_kind *)0x0) {
        quit_fmt("lookup_kind(%d, %d) failed",(ulong)(uint)wVar2,(ulong)(uint)(wVar3 & 0xffU));
      }
      rd_string((char *)itypes,0x50);
      qVar5 = quark_add((char *)itypes);
      poVar4->note_unaware = qVar5;
    }
    rd_u16b(&inscriptions);
    wVar2 = L'\0';
    for (uVar7 = 0; uVar7 < inscriptions; uVar7 = uVar7 + 1) {
      rd_s16b(&runeid);
      rd_string((char *)itypes,0x50);
      rune_set_note((long)runeid,(char *)itypes);
    }
  }
  else {
    message = format("Too many (%u) ignore bytes!");
    note(message);
    wVar2 = L'\xffffffff';
  }
  return wVar2;
}

Assistant:

int rd_ignore(void)
{
	size_t i, j;
	uint8_t tmp8u = 24;
	uint16_t file_e_max;
	uint16_t itype_size;
	uint16_t inscriptions;

	/* Read how many ignore bytes we have */
	rd_byte(&tmp8u);

	/* Check against current number */
	if (tmp8u != ignore_size) {
		strip_bytes(tmp8u);
	} else {
		for (i = 0; i < ignore_size; i++)
			rd_byte(&ignore_level[i]);
	}

	/* Read the number of saved ego-item */
	rd_u16b(&file_e_max);
	rd_u16b(&itype_size);
	if (itype_size > ITYPE_SIZE) {
		note(format("Too many (%u) ignore bytes!", itype_size));
		return (-1);
	}

	for (i = 0; i < file_e_max; i++) {
		if (i < z_info->e_max) {
			bitflag flags, itypes[ITYPE_SIZE];
			
			/* Read and extract the everseen flag */
			rd_byte(&flags);
			e_info[i].everseen = (flags & 0x02) ? true : false;

			/* Read and extract the ignore flags */
			for (j = 0; j < itype_size; j++)
				rd_byte(&itypes[j]);

			/* If number of ignore types has changed, don't set anything */
			if (itype_size == ITYPE_SIZE) {
				for (j = ITYPE_NONE; j < ITYPE_MAX; j++)
					if (itype_has(itypes, j))
						ego_ignore_toggle(i, j);
			}
		}
	}

	/* Read the current number of aware object auto-inscriptions */
	rd_u16b(&inscriptions);

	/* Read the aware object autoinscriptions array */
	for (i = 0; i < inscriptions; i++) {
		char tmp[80];
		uint8_t tval, sval;
		struct object_kind *k;

		rd_string(tmp, sizeof(tmp));
		tval = tval_find_idx(tmp);
		rd_string(tmp, sizeof(tmp));
		sval = lookup_sval(tval, tmp);
		k = lookup_kind(tval, sval);
		if (!k)
			quit_fmt("lookup_kind(%d, %d) failed", tval, sval);
		rd_string(tmp, sizeof(tmp));
		k->note_aware = quark_add(tmp);
	}

	/* Read the current number of unaware object auto-inscriptions */
	rd_u16b(&inscriptions);

	/* Read the unaware object autoinscriptions array */
	for (i = 0; i < inscriptions; i++) {
		char tmp[80];
		uint8_t tval, sval;
		struct object_kind *k;

		rd_string(tmp, sizeof(tmp));
		tval = tval_find_idx(tmp);
		rd_string(tmp, sizeof(tmp));
		sval = lookup_sval(tval, tmp);
		k = lookup_kind(tval, sval);
		if (!k)
			quit_fmt("lookup_kind(%d, %d) failed", tval, sval);
		rd_string(tmp, sizeof(tmp));
		k->note_unaware = quark_add(tmp);
	}

	/* Read the current number of rune auto-inscriptions */
	rd_u16b(&inscriptions);

	/* Read the rune autoinscriptions array */
	for (i = 0; i < inscriptions; i++) {
		char tmp[80];
		int16_t runeid;

		rd_s16b(&runeid);
		rd_string(tmp, sizeof(tmp));
		rune_set_note(runeid, tmp);
	}

	return 0;
}